

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get.hpp
# Opt level: O0

enable_if_t<detail::is_chrono_duration<duration<long,_ratio<1L,_1000000000L>_>_>::value,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
 toml::get<std::chrono::duration<long,std::ratio<1l,1000000000l>>,toml::type_config>
           (basic_value<toml::type_config> *v)

{
  nanoseconds __d;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> _Var1;
  basic_value<toml::type_config> *in_stack_00000030;
  local_time *in_stack_00000038;
  
  basic_value<toml::type_config>::as_local_time(in_stack_00000030);
  __d = local_time::operator_cast_to_duration(in_stack_00000038);
  _Var1 = std::chrono::
          duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                    (__d.__r);
  return (enable_if_t<detail::is_chrono_duration<duration<long,_ratio<1L,_1000000000L>_>_>::value,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          )_Var1.__r;
}

Assistant:

cxx::enable_if_t<detail::is_chrono_duration<T>::value, T>
get(const basic_value<TC>& v)
{
    return std::chrono::duration_cast<T>(
            std::chrono::nanoseconds(v.as_local_time()));
}